

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O0

int equation_system_solve(aom_equation_system_t *eqns)

{
  uint n_00;
  int iVar1;
  double *b_00;
  double *A_00;
  undefined8 *in_RDI;
  int ret;
  double *A;
  double *b;
  int n;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar2;
  int local_4;
  
  n_00 = *(uint *)(in_RDI + 3);
  b_00 = (double *)aom_malloc(0x3c1283);
  A_00 = (double *)aom_malloc(0x3c129f);
  uVar2 = 0;
  if ((A_00 == (double *)0x0) || (b_00 == (double *)0x0)) {
    fprintf(_stderr,"Unable to allocate temp values of size %dx%d\n",(ulong)n_00,(ulong)n_00);
    aom_free((void *)CONCAT44(uVar2,in_stack_ffffffffffffffd0));
    aom_free((void *)CONCAT44(uVar2,in_stack_ffffffffffffffd0));
    local_4 = 0;
  }
  else {
    memcpy(A_00,(void *)*in_RDI,(long)(int)n_00 * 8 * (long)(int)n_00);
    memcpy(b_00,(void *)in_RDI[1],(long)(int)n_00 << 3);
    iVar1 = linsolve(n_00,A_00,*(int *)(in_RDI + 3),b_00,(double *)in_RDI[2]);
    aom_free((void *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
    aom_free((void *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int equation_system_solve(aom_equation_system_t *eqns) {
  const int n = eqns->n;
  double *b = (double *)aom_malloc(sizeof(*b) * n);
  double *A = (double *)aom_malloc(sizeof(*A) * n * n);
  int ret = 0;
  if (A == NULL || b == NULL) {
    fprintf(stderr, "Unable to allocate temp values of size %dx%d\n", n, n);
    aom_free(b);
    aom_free(A);
    return 0;
  }
  memcpy(A, eqns->A, sizeof(*eqns->A) * n * n);
  memcpy(b, eqns->b, sizeof(*eqns->b) * n);
  ret = linsolve(n, A, eqns->n, b, eqns->x);
  aom_free(b);
  aom_free(A);

  if (ret == 0) {
    return 0;
  }
  return 1;
}